

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point.cpp
# Opt level: O0

void __thiscall mnf::ConstSubPoint::ConstSubPoint(ConstSubPoint *this,Manifold *M,ConstRefVec *val)

{
  Scalar *dataPtr;
  Index IVar1;
  Index IVar2;
  Stride<0,_0> local_3a;
  DenseBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  local_38 [24];
  ConstRefVec *local_20;
  ConstRefVec *val_local;
  Manifold *M_local;
  ConstSubPoint *this_local;
  
  this->manifold_ = M;
  local_20 = val;
  val_local = (ConstRefVec *)M;
  M_local = (Manifold *)this;
  dataPtr = Eigen::
            MapBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
            ::data((MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                    *)val);
  IVar1 = Eigen::
          EigenBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ::size((EigenBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                  *)local_20);
  Eigen::Stride<0,_0>::Stride(&local_3a);
  Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)local_38,
             dataPtr,IVar1,&local_3a);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> *)&this->value_,
             local_38,(type *)0x0);
  Eigen::IOFormat::IOFormat(&this->format_,(IOFormat *)defaultFormat);
  IVar2 = Manifold::representationDim((Manifold *)val_local);
  IVar1 = Eigen::
          EigenBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ::size((EigenBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                  *)local_20);
  mnf_assert(IVar2 == IVar1);
  registerPoint(this);
  return;
}

Assistant:

ConstSubPoint::ConstSubPoint(const Manifold& M, const ConstRefVec& val)
    : manifold_(M),
      value_(Eigen::Map<Eigen::VectorXd>(const_cast<double*>(val.data()),
                                         val.size())),
      format_(mnf::defaultFormat)
{
  mnf_assert(M.representationDim() == val.size());
  registerPoint();
}